

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

DynamicType * __thiscall
Js::JavascriptLibrary::CreateAsyncGeneratorType(JavascriptLibrary *this,RecyclableObject *prototype)

{
  ScriptContext *scriptContext;
  DynamicTypeHandler *typeHandler;
  DynamicType *pDVar1;
  
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  typeHandler = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  pDVar1 = DynamicType::New(scriptContext,TypeIds_AsyncGenerator,prototype,(JavascriptMethod)0x0,
                            typeHandler,false,false);
  return pDVar1;
}

Assistant:

DynamicType* JavascriptLibrary::CreateAsyncGeneratorType(RecyclableObject* prototype)
    {
        return DynamicType::New(
            scriptContext,
            TypeIds_AsyncGenerator,
            prototype,
            nullptr,
            NullTypeHandler<false>::GetDefaultInstance());
    }